

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

_Bool player_get_recall_depth(player *p)

{
  wchar_t wVar1;
  _Bool _Var2;
  ulong uVar3;
  
  _Var2 = true;
  if ((0 < p->max_depth) && ((p->opts).opt[0x20] == false)) {
    wVar1 = get_quantity("Which level do you wish to return to (0 to cancel)? ",(int)p->max_depth);
    if (wVar1 == L'\0') {
      _Var2 = false;
    }
    else {
      _Var2 = false;
      do {
        if ((ulong)chunk_list_max != 0) {
          uVar3 = 0;
          do {
            if (chunk_list[uVar3]->depth == wVar1) {
              p->recall_depth = (int16_t)wVar1;
              return true;
            }
            uVar3 = uVar3 + 1;
          } while (chunk_list_max != uVar3);
        }
        msg("You must choose a level you have previously visited.");
        wVar1 = get_quantity("Which level do you wish to return to (0 to cancel)? ",
                             (int)p->max_depth);
      } while (wVar1 != L'\0');
    }
  }
  return _Var2;
}

Assistant:

bool player_get_recall_depth(struct player *p)
{
	bool level_ok = false;
	int new = 0;

	/*
	 * No choice when have not entered the dungeon or descent is forced,
	 * so do not prompt.
	 */
	if (p->max_depth <= 0 || OPT(p, birth_force_descend)) {
		return true;
	}
	while (!level_ok) {
		const char *prompt =
			"Which level do you wish to return to (0 to cancel)? ";
		int i;

		/* Choose the level */
		new = get_quantity(prompt, p->max_depth);
		if (new == 0) {
			return false;
		}

		/* Is that level valid? */
		for (i = 0; i < chunk_list_max; i++) {
			if (chunk_list[i]->depth == new) {
				level_ok = true;
				break;
			}
		}
		if (!level_ok) {
			msg("You must choose a level you have previously visited.");
		}
	}
	p->recall_depth = new;
	return true;
}